

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Flow * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitMemoryFill
          (Flow *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,MemoryFill *curr)

{
  ExternalInterface *pEVar1;
  Name memory;
  ulong uVar2;
  undefined1 this_00 [8];
  bool bVar3;
  int32_t iVar4;
  ExpressionRunner<wasm::ModuleRunner> *pEVar5;
  Literal *pLVar6;
  uint64_t uVar7;
  address64_t aVar8;
  address64_t aVar9;
  address64_t aVar10;
  Literal local_198;
  address64_t local_180;
  ulong local_178;
  size_t i;
  uint8_t val;
  Address local_150;
  Address memorySize;
  undefined1 local_130 [8];
  MemoryInstanceInfo info;
  Address sizeVal;
  Address destVal;
  Flow size;
  Flow value;
  undefined1 local_68 [8];
  Flow dest;
  MemoryFill *curr_local;
  ModuleRunnerBase<wasm::ModuleRunner> *this_local;
  
  dest.breakTo.super_IString.str._M_str = (char *)curr;
  pEVar5 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
  ExpressionRunner<wasm::ModuleRunner>::visit
            ((Flow *)local_68,pEVar5,*(Expression **)(dest.breakTo.super_IString.str._M_str + 0x10))
  ;
  bVar3 = Flow::breaking((Flow *)local_68);
  if (bVar3) {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_68);
    goto LAB_01466839;
  }
  pEVar5 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
  ExpressionRunner<wasm::ModuleRunner>::visit
            ((Flow *)&size.breakTo.super_IString.str._M_str,pEVar5,
             *(Expression **)(dest.breakTo.super_IString.str._M_str + 0x18));
  bVar3 = Flow::breaking((Flow *)&size.breakTo.super_IString.str._M_str);
  if (bVar3) {
    Flow::Flow(__return_storage_ptr__,(Flow *)&size.breakTo.super_IString.str._M_str);
  }
  else {
    pEVar5 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
    ExpressionRunner<wasm::ModuleRunner>::visit
              ((Flow *)&destVal,pEVar5,
               *(Expression **)(dest.breakTo.super_IString.str._M_str + 0x20));
    bVar3 = Flow::breaking((Flow *)&destVal);
    if (bVar3) {
      Flow::Flow(__return_storage_ptr__,(Flow *)&destVal);
    }
    else {
      pLVar6 = Flow::getSingleValue((Flow *)local_68);
      uVar7 = wasm::Literal::getUnsigned(pLVar6);
      wasm::Address::Address(&sizeVal,uVar7);
      pLVar6 = Flow::getSingleValue((Flow *)&destVal);
      uVar7 = wasm::Literal::getUnsigned(pLVar6);
      wasm::Address::Address((Address *)&info.name.super_IString.str._M_str,uVar7);
      memorySize.addr = (((IString *)(dest.breakTo.super_IString.str._M_str + 0x28))->str)._M_len;
      getMemoryInstanceInfo
                ((MemoryInstanceInfo *)local_130,this,
                 (Name)((IString *)(dest.breakTo.super_IString.str._M_str + 0x28))->str);
      memory.super_IString.str._M_len._4_4_ = info.instance._4_4_;
      memory.super_IString.str._M_len._0_4_ = info.instance._0_4_;
      memory.super_IString.str._M_str._4_4_ = info.name.super_IString.str._M_len._4_4_;
      memory.super_IString.str._M_str._0_4_ = (undefined4)info.name.super_IString.str._M_len;
      local_150 = getMemorySize((ModuleRunnerBase<wasm::ModuleRunner> *)local_130,memory);
      aVar8 = wasm::Address::operator_cast_to_unsigned_long(&sizeVal);
      aVar9 = wasm::Address::operator_cast_to_unsigned_long(&local_150);
      if (aVar9 << 0x10 < aVar8) {
LAB_0146667c:
        (*(this->super_ExpressionRunner<wasm::ModuleRunner>)._vptr_ExpressionRunner[2])
                  (this,"out of bounds memory access in memory.fill");
      }
      else {
        aVar8 = wasm::Address::operator_cast_to_unsigned_long
                          ((Address *)&info.name.super_IString.str._M_str);
        aVar9 = wasm::Address::operator_cast_to_unsigned_long(&local_150);
        if (aVar9 << 0x10 < aVar8) goto LAB_0146667c;
        aVar8 = wasm::Address::operator_cast_to_unsigned_long(&sizeVal);
        aVar9 = wasm::Address::operator_cast_to_unsigned_long
                          ((Address *)&info.name.super_IString.str._M_str);
        aVar10 = wasm::Address::operator_cast_to_unsigned_long(&local_150);
        if (aVar10 << 0x10 < aVar8 + aVar9) goto LAB_0146667c;
      }
      pLVar6 = Flow::getSingleValue((Flow *)&size.breakTo.super_IString.str._M_str);
      iVar4 = wasm::Literal::geti32(pLVar6);
      i._7_1_ = (char)iVar4;
      local_178 = 0;
      while( true ) {
        uVar2 = local_178;
        aVar8 = wasm::Address::operator_cast_to_unsigned_long
                          ((Address *)&info.name.super_IString.str._M_str);
        this_00 = local_130;
        if (aVar8 <= uVar2) break;
        pEVar1 = *(ExternalInterface **)((long)local_130 + 0x288);
        aVar8 = wasm::Address::operator_cast_to_unsigned_long(&sizeVal);
        wasm::Literal::Literal(&local_198,aVar8 + local_178);
        local_180 = (address64_t)
                    getFinalAddressWithoutOffset
                              ((ModuleRunnerBase<wasm::ModuleRunner> *)this_00,&local_198,1,
                               local_150);
        (*pEVar1->_vptr_ExternalInterface[0x16])
                  (pEVar1,local_180,(ulong)(uint)(int)i._7_1_,
                   CONCAT44(info.instance._4_4_,info.instance._0_4_),
                   CONCAT44(info.name.super_IString.str._M_len._4_4_,
                            (undefined4)info.name.super_IString.str._M_len));
        wasm::Literal::~Literal(&local_198);
        local_178 = local_178 + 1;
      }
      Flow::Flow(__return_storage_ptr__);
    }
    Flow::~Flow((Flow *)&destVal);
  }
  Flow::~Flow((Flow *)&size.breakTo.super_IString.str._M_str);
LAB_01466839:
  Flow::~Flow((Flow *)local_68);
  return __return_storage_ptr__;
}

Assistant:

Flow visitMemoryFill(MemoryFill* curr) {
    NOTE_ENTER("MemoryFill");
    Flow dest = self()->visit(curr->dest);
    if (dest.breaking()) {
      return dest;
    }
    Flow value = self()->visit(curr->value);
    if (value.breaking()) {
      return value;
    }
    Flow size = self()->visit(curr->size);
    if (size.breaking()) {
      return size;
    }
    NOTE_EVAL1(dest);
    NOTE_EVAL1(value);
    NOTE_EVAL1(size);
    Address destVal(dest.getSingleValue().getUnsigned());
    Address sizeVal(size.getSingleValue().getUnsigned());

    auto info = getMemoryInstanceInfo(curr->memory);
    auto memorySize = info.instance->getMemorySize(info.name);
    // FIXME: cheaper wrapping detection?
    if (destVal > memorySize * Memory::kPageSize ||
        sizeVal > memorySize * Memory::kPageSize ||
        destVal + sizeVal > memorySize * Memory::kPageSize) {
      trap("out of bounds memory access in memory.fill");
    }
    uint8_t val(value.getSingleValue().geti32());
    for (size_t i = 0; i < sizeVal; ++i) {
      info.instance->externalInterface->store8(
        info.instance->getFinalAddressWithoutOffset(
          Literal(destVal + i), 1, memorySize),
        val,
        info.name);
    }
    return {};
  }